

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O0

double ZXing::IsPattern<false,3,4>
                 (PatternView *view,FixedPattern<3,_4,_false> *pattern,int spaceInPixel,
                 double minQuietZone,double moduleSizeRef)

{
  int iVar1;
  int in_EDX;
  FixedPattern<3,_4,_false> *in_RSI;
  PatternView *in_RDI;
  FixedPattern<3,_4,_false> *pFVar2;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  PatternView *in_XMM1_Qa;
  int x;
  double threshold;
  double moduleSize;
  double width;
  int local_4c;
  undefined8 in_stack_ffffffffffffffc8;
  PatternView *local_8;
  
  iVar1 = PatternView::sum(in_XMM1_Qa,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (4.0 <= (double)iVar1) {
    local_8 = (PatternView *)((double)iVar1 / 4.0);
    if (((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) ||
       (in_XMM0_Qa * (double)local_8 + -1.0 <= (double)in_EDX)) {
      if (((double)in_XMM1_Qa == 0.0) && (!NAN((double)in_XMM1_Qa))) {
        in_XMM1_Qa = local_8;
      }
      for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
        PatternView::operator[](in_RDI,local_4c);
        pFVar2 = in_RSI;
        FixedPattern<3,_4,_false>::operator[](in_RSI,local_4c);
        std::abs((int)pFVar2);
        if ((double)in_XMM1_Qa * 0.5 + 0.5 < extraout_XMM0_Qa) {
          return 0.0;
        }
      }
    }
    else {
      local_8 = (PatternView *)0x0;
    }
  }
  else {
    local_8 = (PatternView *)0x0;
  }
  return (double)local_8;
}

Assistant:

double IsPattern(const PatternView& view, const FixedPattern<LEN, SUM, false>& pattern, int spaceInPixel = 0,
				double minQuietZone = 0, double moduleSizeRef = 0)
{
	if constexpr (E2E) {
		auto widths = BarAndSpaceSum<LEN, double>(view.data());
		auto sums = pattern.sums();
		BarAndSpace<double> modSize = {widths[0] / sums[0], widths[1] / sums[1]};

		auto [m, M] = std::minmax(modSize[0], modSize[1]);
		if (M > 4 * m) // make sure module sizes of bars and spaces are not too far away from each other
			return 0;

		if (minQuietZone && spaceInPixel < minQuietZone * modSize.space)
			return 0;

		const BarAndSpace<double> thr = {modSize[0] * .75 + .5, modSize[1] / (2 + (LEN < 6)) + .5};

		for (int x = 0; x < LEN; ++x)
			if (std::abs(view[x] - pattern[x] * modSize[x]) > thr[x])
				return 0;

		return (modSize[0] + modSize[1]) / 2;
	}

	double width = view.sum(LEN);
	if (SUM > LEN && width < SUM)
		return 0;

	const auto moduleSize = width / SUM;

	if (minQuietZone && spaceInPixel < minQuietZone * moduleSize - 1)
		return 0;

	if (!moduleSizeRef)
		moduleSizeRef = moduleSize;

	// the offset of 0.5 is to make the code less sensitive to quantization errors for small (near 1) module sizes.
	// TODO: review once we have upsampling in the binarizer in place.
	const auto threshold = moduleSizeRef * (0.5 + E2E * 0.25) + 0.5;

	for (int x = 0; x < LEN; ++x)
		if (std::abs(view[x] - pattern[x] * moduleSizeRef) > threshold)
			return 0;

	return moduleSize;
}